

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O2

void __thiscall
adios2::helper::NdCopy::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,CoreDims *ioStride,CoreDims *ioCount,size_t elmSize)

{
  long lVar1;
  size_t *psVar2;
  ulong uVar3;
  long lVar4;
  
  lVar1 = *(long *)(this + 8);
  *(CoreDims **)(lVar1 + -8 + *(long *)this * 8) = ioCount;
  uVar3 = *(ulong *)this;
  if (1 < uVar3) {
    psVar2 = ioStride->DimensSpan;
    *(size_t *)(lVar1 + -0x10 + uVar3 * 8) = (long)ioCount * psVar2[uVar3 - 1];
    uVar3 = *(ulong *)this;
    if (2 < uVar3) {
      lVar4 = *(long *)(lVar1 + -0x10 + uVar3 * 8);
      do {
        lVar4 = lVar4 * psVar2[uVar3 - 2];
        *(long *)(lVar1 + -0x18 + uVar3 * 8) = lVar4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 2);
    }
  }
  return;
}

Assistant:

size_t size() const { return DimCount; }